

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_4cf1ce::HandleNormalPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  string_view value;
  path local_108;
  cmCMakePath path;
  string inputPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  OutputVariable arguments;
  
  if ((anonymous_namespace)::
      HandleNormalPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleNormalPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar3 != 0) {
      ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
      ArgumentParserWithOutputVariable
                (&HandleNormalPathCommand::parser.
                  super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>);
      __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
                   ~CMakePathArgumentParser,&HandleNormalPathCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleNormalPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::Parse<2>
            (&arguments,
             &HandleNormalPathCommand::parser.
              super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>,args);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError
                    (&arguments.super_ParseResult,status->Makefile);
  bVar2 = true;
  if (!bVar1) {
    if (HandleNormalPathCommand::parser.
        super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
        super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        HandleNormalPathCommand::parser.
        super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
        super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      inputPath._M_dataplus._M_p = (pointer)&inputPath.field_2;
      inputPath._M_string_length = 0;
      inputPath.field_2._M_local_buf[0] = '\0';
      bVar2 = getInputPath((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,status,&inputPath);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_98,(string *)&inputPath);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)&local_108,&local_98,generic_format);
        cmCMakePath::Normal(&path,(cmCMakePath *)&local_108);
        std::filesystem::__cxx11::path::~path(&local_108);
        std::__cxx11::string::~string((string *)&local_98);
        this = status->Makefile;
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::filesystem::__cxx11::path::string(&local_108._M_pathname,&path.Path);
        pbVar4 = pbVar4 + 1;
        if (arguments.Output.
            super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_engaged != false) {
          pbVar4 = (pointer)&arguments.Output;
        }
        value._M_str = local_108._M_pathname._M_dataplus._M_p;
        value._M_len = local_108._M_pathname._M_string_length;
        cmMakefile::AddDefinition(this,pbVar4,value);
        std::__cxx11::string::~string((string *)&local_108);
        std::filesystem::__cxx11::path::~path(&path.Path);
      }
      std::__cxx11::string::~string((string *)&inputPath);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,"NORMAL_PATH called with unexpected arguments.",
                 (allocator<char> *)&local_108);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&path);
      bVar2 = false;
    }
  }
  OutputVariable::~OutputVariable(&arguments);
  return bVar2;
}

Assistant:

bool HandleNormalPathCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  static OutputVariableParser const parser{};

  const auto arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError("NORMAL_PATH called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  auto path = cmCMakePath(inputPath).Normal();

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}